

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatred.cpp
# Opt level: O1

void __thiscall
TPZMatRed<float,_TPZVerySparseMatrix<float>_>::TPZMatRed
          (TPZMatRed<float,_TPZVerySparseMatrix<float>_> *this)

{
  _Rb_tree_header *p_Var1;
  TPZReference *pTVar2;
  TPZReference *pTVar3;
  
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZMatRed_01898018;
  pTVar2 = (TPZReference *)operator_new(0x10);
  pTVar2->fPointer = (TPZMatrix<float> *)0x0;
  (pTVar2->fCounter).super___atomic_base<int>._M_i = 0;
  LOCK();
  (pTVar2->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fK00).fRef = pTVar2;
  pTVar3 = (TPZReference *)operator_new(0x10);
  pTVar3->fPointer = (TPZMatrixSolver<float> *)0x0;
  (pTVar3->fCounter).super___atomic_base<int>._M_i = 0;
  LOCK();
  (pTVar3->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fSolver).fRef = pTVar3;
  (this->fK11).super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 0;
  (this->fK11).super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 0;
  (this->fK11).super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  (this->fK11).super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  (this->fK11).super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018456d0;
  (this->fK11).fElem = (float *)0x0;
  (this->fK11).fGiven = (float *)0x0;
  (this->fK11).fSize = 0;
  TPZVec<int>::TPZVec(&(this->fK11).fPivot.super_TPZVec<int>,0);
  (this->fK11).fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  (this->fK11).fPivot.super_TPZVec<int>.fStore = (this->fK11).fPivot.fExtAlloc;
  (this->fK11).fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fK11).fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fK11).fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
  (this->fK11).fWork.fStore = (float *)0x0;
  (this->fK11).fWork.fNElements = 0;
  (this->fK11).fWork.fNAlloc = 0;
  (this->fK01).super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 0;
  (this->fK01).super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 0;
  (this->fK01).super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  (this->fK01).super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  (this->fK01).super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZVerySparseMatrix_01895590;
  p_Var1 = &(this->fK01).fExtraSparseData._M_t._M_impl.super__Rb_tree_header;
  (this->fK01).fExtraSparseData._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fK01).fExtraSparseData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->fK01).fExtraSparseData._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->fK01).fExtraSparseData._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->fK01).fExtraSparseData._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->fK10).super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 0;
  (this->fK10).super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 0;
  (this->fK10).super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  (this->fK10).super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  (this->fK10).super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZVerySparseMatrix_01895590;
  p_Var1 = &(this->fK10).fExtraSparseData._M_t._M_impl.super__Rb_tree_header;
  (this->fK10).fExtraSparseData._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fK10).fExtraSparseData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->fK10).fExtraSparseData._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->fK10).fExtraSparseData._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->fK10).fExtraSparseData._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->fF0).super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  (this->fF0).super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  (this->fF0).super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 0;
  (this->fF0).super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 0;
  (this->fF0).super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018456d0;
  (this->fF0).fSize = 0;
  (this->fF0).fElem = (float *)0x0;
  (this->fF0).fGiven = (float *)0x0;
  TPZVec<int>::TPZVec(&(this->fF0).fPivot.super_TPZVec<int>,0);
  (this->fF0).fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  (this->fF0).fPivot.super_TPZVec<int>.fStore = (this->fF0).fPivot.fExtAlloc;
  (this->fF0).fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fF0).fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fF0).fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
  (this->fF0).fWork.fStore = (float *)0x0;
  (this->fF0).fWork.fNElements = 0;
  (this->fF0).fWork.fNAlloc = 0;
  (this->fF1).super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 0;
  (this->fF1).super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 0;
  (this->fF1).super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  (this->fF1).super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  (this->fF1).super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018456d0;
  (this->fF1).fElem = (float *)0x0;
  (this->fF1).fGiven = (float *)0x0;
  (this->fF1).fSize = 0;
  TPZVec<int>::TPZVec(&(this->fF1).fPivot.super_TPZVec<int>,0);
  (this->fF1).fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  (this->fF1).fPivot.super_TPZVec<int>.fStore = (this->fF1).fPivot.fExtAlloc;
  (this->fF1).fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fF1).fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fF1).fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
  this->fMaxRigidBodyModes = 0;
  this->fNumberRigidBodyModes = 0;
  (this->fF1).fWork.fStore = (float *)0x0;
  (this->fF1).fWork.fNElements = 0;
  (this->fF1).fWork.fNAlloc = 0;
  this->fDim0 = 0;
  *(undefined8 *)((long)&this->fDim0 + 3) = 0;
  *(undefined8 *)((long)&this->fDim1 + 3) = 0;
  return;
}

Assistant:

TPZMatRed<TVar,  TSideMatrix>::TPZMatRed () : 
TPZRegisterClassId(&TPZMatRed::ClassId),
TPZMatrix<TVar>( 0, 0 ), fK11(0,0),fK01(0,0),fK10(0,0),fF0(0,0),fF1(0,0), fMaxRigidBodyModes(0), fNumberRigidBodyModes(0)
{
	fDim0=0;
	fDim1=0;
	fK01IsComputed = 0;
	fIsReduced = 0;
    fF0IsComputed = false;
}